

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void reshade(bool keep)

{
  uint x;
  uint y_00;
  undefined1 uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ostream *poVar5;
  clock_t cVar6;
  float *pfVar7;
  clock_t cVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  undefined7 in_register_00000039;
  int y;
  ulong uVar12;
  undefined1 *puVar13;
  int j;
  Vector3f *this;
  double dVar14;
  void *local_98;
  Camera *camera;
  vector<std::future<bool>,_std::allocator<std::future<bool>_>_> v;
  
  iVar2 = cnt + 1;
  cnt = 1;
  if ((int)CONCAT71(in_register_00000039,keep) != 0) {
    cnt = iVar2;
  }
  camera = scene.camera;
  x = (scene.camera)->width;
  y_00 = (scene.camera)->height;
  lVar4 = (long)(int)y_00 * (long)(int)x;
  if ((int)lVar4 == 0) {
    local_98 = (void *)0x0;
  }
  else {
    local_98 = malloc(lVar4 * 3);
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"shading start (");
  poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  poVar5 = std::operator<<(poVar5,",");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,cnt);
  poVar5 = std::operator<<(poVar5,")");
  std::endl<char,std::char_traits<char>>(poVar5);
  cVar6 = clock();
  if (!keep) {
    puVar13 = tot;
    for (uVar11 = 0; this = (Vector3f *)puVar13, uVar9 = (ulong)(~((int)y_00 >> 0x1f) & y_00),
        uVar11 != (~((int)x >> 0x1f) & x); uVar11 = uVar11 + 1) {
      while (uVar9 != 0) {
        Vector3f::operator=(this,&Vector3f::ZERO);
        this = this + 1;
        uVar9 = uVar9 - 1;
      }
      puVar13 = (undefined1 *)((long)puVar13 + 24000);
    }
  }
  std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::vector
            (&v,(long)(int)x,(allocator_type *)&stack0xffffffffffffffc0);
  for (iVar2 = 0; iVar2 < (int)x; iVar2 = iVar2 + 1) {
    ThreadPool::enqueue<bool(&)(Camera*,int),Camera*&,int&>
              ((ThreadPool *)&stack0xffffffffffffffc0,(_func_bool_Camera_ptr_int *)pool,
               (Camera **)execute,(int *)&camera);
    std::future<bool>::operator=
              (v.super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>._M_impl.
               super__Vector_impl_data._M_start + iVar2,(future<bool> *)&stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  }
  uVar11 = (ulong)(~((int)x >> 0x1f) & x);
  for (lVar4 = 0; uVar11 << 4 != lVar4; lVar4 = lVar4 + 0x10) {
    std::future<bool>::get
              ((future<bool> *)
               ((long)&((v.
                         super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>.
                         _M_impl.super__Vector_impl_data._M_start)->super___basic_future<bool>).
                       _M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar4));
  }
  iVar2 = 0;
  for (uVar9 = 0; uVar9 != uVar11; uVar9 = uVar9 + 1) {
    iVar10 = iVar2;
    for (uVar12 = 0; uVar12 != (~((int)y_00 >> 0x1f) & y_00); uVar12 = uVar12 + 1) {
      for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
        pfVar7 = Vector3f::operator[]((Vector3f *)(tot + uVar12 * 0xc + uVar9 * 24000),(int)lVar4);
        uVar3 = (uint)((*pfVar7 / (float)cnt) * 255.0);
        uVar3 = ~((int)uVar3 >> 0x1f) & uVar3;
        uVar1 = (undefined1)uVar3;
        if (0xfe < (int)uVar3) {
          uVar1 = 0xff;
        }
        *(undefined1 *)((long)local_98 + lVar4 + iVar10) = uVar1;
      }
      iVar10 = iVar10 + x * 3;
    }
    iVar2 = iVar2 + 3;
  }
  cVar8 = clock();
  stbi_write_bmp("output.bmp",x,y_00,3,local_98);
  std::operator<<((ostream *)&std::cerr,"end shading ");
  dVar14 = (double)(cVar8 - cVar6) / 1000000.0;
  poVar5 = std::ostream::_M_insert<double>(dVar14);
  std::operator<<(poVar5,"s    ");
  poVar5 = std::ostream::_M_insert<double>(1.0 / dVar14);
  std::operator<<(poVar5,"fps\n");
  std::operator<<((ostream *)&std::cerr,"time passed: ");
  poVar5 = std::ostream::_M_insert<double>((double)cVar8 / 1000000.0);
  std::operator<<(poVar5,"s\n");
  std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::~vector(&v);
  return;
}

Assistant:

void reshade(bool keep)
{
	if (!keep) cnt = 1; else ++cnt;
	unsigned char* img = 0; int ls = 0;
	Camera* camera = scene.camera;
	int w = camera->getWidth(), h = camera->getHeight(), s = w * h * 3;
	if (s != ls) free(img), img = (unsigned char* )malloc(sizeof(unsigned char) * (ls=s));
	std::cerr << "shading start (" << keep << "," << cnt << ")" << std::endl;
	time_t t1 = clock();
	if (!keep)
		for (int x = 0; x < w; ++x)
			for (int y = 0; y < h; ++y)
				tot[x][y] = Vector3f::ZERO;
	std::vector<std::future<bool>> v(w);
	for (int x = 0; x < w; ++x)
		v[x]=pool->enqueue(execute, camera, x);
	for (int x = 0; x < w; ++x) v[x].get();
	for (int x = 0; x < w; ++x)
		for (int y = 0; y < h; ++y)
		{
			for (int j = 0; j < 3; ++j)
			{
				int ww = tot[x][y][j] / cnt * 255;
				if (ww < 0) ww = 0;
				if (ww > 255) ww = 255;
				img[x * 3 + y * w * 3 + j] = ww;
			}
		}
	time_t t2 = clock();
	stbi_write_bmp("output.bmp", w, h, 3, img);
	std::cerr << "end shading " << (t2 - t1) * 1.0 / CLOCKS_PER_SEC << "s    " << 1.0 / ((t2 - t1) * 1.0 / CLOCKS_PER_SEC) << "fps\n";
	std::cerr << "time passed: " << t2 * 1.0 / CLOCKS_PER_SEC << "s\n";
}